

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLFeeder_Easy::FillHeader(NLFeeder_Easy *this)

{
  NLModel *pNVar1;
  char **ppcVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  NLFeeder_Easy *in_RDI;
  int i_1;
  char **pn_1;
  int i;
  char **pn;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_t local_48;
  int local_24;
  int local_14;
  
  (in_RDI->header_).super_NLInfo.super_NLInfo_C.format = (uint)((in_RDI->nlopt_).n_text_mode_ == 0);
  (in_RDI->header_).super_NLInfo.super_NLInfo_C.flags = (in_RDI->nlopt_).flags_;
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len = 0;
  pNVar1 = NLME(in_RDI);
  ppcVar2 = NLModel::ColNames(pNVar1);
  if (ppcVar2 != (char **)0x0) {
    pNVar1 = NLME(in_RDI);
    local_14 = NLModel::NumCols(pNVar1);
    while (iVar5 = local_14 + -1, local_14 != 0) {
      local_14 = iVar5;
      if (ppcVar2[iVar5] != (char *)0x0) {
        in_stack_ffffffffffffffa4 =
             (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len;
        sVar3 = strlen(ppcVar2[iVar5]);
        if (in_stack_ffffffffffffffa4 < (int)sVar3) {
          sVar3 = strlen(ppcVar2[iVar5]);
          (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len = (int)sVar3;
        }
      }
    }
  }
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = 0;
  pNVar1 = NLME(in_RDI);
  ppcVar2 = NLModel::RowNames(pNVar1);
  if (ppcVar2 != (char **)0x0) {
    pNVar1 = NLME(in_RDI);
    local_24 = NLModel::NumRows(pNVar1);
    while (iVar5 = local_24 + -1, local_24 != 0) {
      local_24 = iVar5;
      if (ppcVar2[iVar5] != (char *)0x0) {
        in_stack_ffffffffffffffa0 =
             (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len;
        sVar3 = strlen(ppcVar2[iVar5]);
        if (in_stack_ffffffffffffffa0 < (int)sVar3) {
          sVar3 = strlen(ppcVar2[iVar5]);
          (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = (int)sVar3;
        }
      }
    }
  }
  iVar5 = (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len;
  pNVar1 = NLME(in_RDI);
  pcVar4 = NLModel::ObjName(pNVar1);
  sVar3 = strlen(pcVar4);
  if (iVar5 < (int)sVar3) {
    pNVar1 = NLME(in_RDI);
    pcVar4 = NLModel::ObjName(pNVar1);
    sVar3 = strlen(pcVar4);
    (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_con_name_len = (int)sVar3;
  }
  pNVar1 = NLME(in_RDI);
  iVar5 = NLModel::NumRows(pNVar1);
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons = iVar5;
  NLME(in_RDI);
  NLModel::GetA((NLModel *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = local_48;
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs = 1;
  pNVar1 = NLME(in_RDI);
  iVar5 = NLModel::NumRows(pNVar1);
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_ranges = iVar5;
  pNVar1 = NLME(in_RDI);
  iVar5 = NLModel::NumCols(pNVar1);
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars = iVar5;
  pNVar1 = NLME(in_RDI);
  pcVar4 = NLModel::ProbName(pNVar1);
  (in_RDI->header_).super_NLInfo.super_NLInfo_C.prob_name = pcVar4;
  return;
}

Assistant:

void FillHeader() {
    header_.format = nlopt_.n_text_mode_
        ? NL_FORMAT_TEXT : NL_FORMAT_BINARY;
    header_.flags = nlopt_.flags_;

    header_.max_var_name_len = 0;
    if (auto pn = NLME().ColNames())
      for (auto i=NLME().NumCols(); i--; )
        if (pn[i]
            && header_.max_var_name_len<(int)std::strlen(pn[i]))
          header_.max_var_name_len=(int)std::strlen(pn[i]);
    header_.max_con_name_len = 0;
    if (auto pn = NLME().RowNames())
      for (auto i=NLME().NumRows(); i--; )
        if (pn[i]
            && header_.max_con_name_len<(int)std::strlen(pn[i]))
          header_.max_con_name_len=(int)std::strlen(pn[i]);
    if (header_.max_con_name_len<(int)std::strlen(NLME().ObjName()))
      header_.max_con_name_len=(int)std::strlen(NLME().ObjName());

    header_.num_algebraic_cons = NLME().NumRows();
    // Need number of Jacobian nonzeros.
    // For linear constraints, it's just those in A.
    header_.num_con_nonzeros = NLME().GetA().num_nz_;
    // (Non)linear binary/int vars,
    // num_obj_nonzeros filled before
    // ...

    header_.num_objs = 1;
    header_.num_ranges = NLME().NumRows();
    header_.num_vars = NLME().NumCols();
    header_.prob_name = NLME().ProbName();
  }